

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YamlParser.h
# Opt level: O0

void __thiscall yaml::Value::Value(Value *this,Value *param_1)

{
  Value *param_1_local;
  Value *this_local;
  
  this->type_ = param_1->type_;
  std::__cxx11::string::string((string *)&this->string_,(string *)&param_1->string_);
  Mapping::Mapping(&this->mapping_,&param_1->mapping_);
  std::vector<yaml::Value,_std::allocator<yaml::Value>_>::vector
            (&this->sequence_,&param_1->sequence_);
  return;
}

Assistant:

ExpectedRef<const Mapping, std::string> getMapping() const {
		if (type_ != Type::Mapping)
			return Unexpected<std::string>("Value is not of Mapping type");
		return std::cref(mapping_);
	}